

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_buffer.cpp
# Opt level: O2

UndoBufferProperties __thiscall duckdb::UndoBuffer::GetProperties(UndoBuffer *this)

{
  int iVar1;
  uint uVar2;
  BufferManager *pBVar3;
  bool bVar4;
  DuckIndexEntry *index;
  _Head_base<0UL,_duckdb::UndoBufferEntry_*,_false> _Var5;
  UndoBufferEntry *pUVar6;
  int *piVar7;
  CatalogEntry *pCVar8;
  idx_t iVar9;
  ulong uVar10;
  ulong uVar11;
  UndoBufferProperties UVar12;
  IteratorState iterator_state;
  IteratorState local_78;
  BufferHandle local_48;
  
  _Var5._M_head_impl =
       (this->allocator).head.
       super_unique_ptr<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>_>._M_t
       .
       super___uniq_ptr_impl<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::UndoBufferEntry_*,_std::default_delete<duckdb::UndoBufferEntry>_>
       .super__Head_base<0UL,_duckdb::UndoBufferEntry_*,_false>._M_head_impl;
  iVar9 = 0;
  if (_Var5._M_head_impl == (UndoBufferEntry *)0x0) {
    uVar10 = 0;
  }
  else {
    for (; _Var5._M_head_impl != (UndoBufferEntry *)0x0;
        _Var5._M_head_impl =
             *(UndoBufferEntry **)
              &((unique_ptr<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>,_true>
                 *)((long)_Var5._M_head_impl + 0x28))->
               super_unique_ptr<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>_>
        ) {
      iVar9 = iVar9 + *(idx_t *)((long)_Var5._M_head_impl + 0x18);
    }
    IteratorState::IteratorState(&local_78);
    uVar10 = 0;
    local_78.current.ptr = (this->allocator).tail.ptr;
    while (local_78.current.ptr != (UndoBufferEntry *)0x0) {
      pBVar3 = (this->allocator).buffer_manager;
      pUVar6 = optional_ptr<duckdb::UndoBufferEntry,_true>::operator->(&local_78.current);
      (*pBVar3->_vptr_BufferManager[7])(&local_48,pBVar3,&pUVar6->block);
      BufferHandle::operator=(&local_78.handle,&local_48);
      BufferHandle::~BufferHandle(&local_48);
      piVar7 = (int *)BufferHandle::Ptr(&local_78.handle);
      local_78.start = (data_ptr_t)piVar7;
      pUVar6 = optional_ptr<duckdb::UndoBufferEntry,_true>::operator->(&local_78.current);
      local_78.end = (data_ptr_t)((long)piVar7 + pUVar6->position);
      for (; local_78.start < local_78.end;
          local_78.start = (data_ptr_t)((ulong)uVar2 + (long)local_78.start)) {
        iVar1 = *(int *)local_78.start;
        uVar2 = *(uint *)((long)local_78.start + 4);
        piVar7 = (int *)((long)local_78.start + 8);
        if (iVar1 == 1) {
          local_78.start = (data_ptr_t)piVar7;
          pCVar8 = CatalogEntry::Parent(*(CatalogEntry **)piVar7);
          uVar11 = uVar10 & 0xffffffff00ffffff | 0x1000000;
          if (pCVar8->type == INDEX_ENTRY) {
            iVar9 = iVar9 + pCVar8[2].timestamp.super___atomic_base<unsigned_long>._M_i;
          }
          else if (pCVar8->type == DELETED_ENTRY) {
            uVar11 = uVar10 & 0xffffff0000ffffff | 0x101000000;
          }
        }
        else if (iVar1 == 3) {
          if ((char)*(int *)((long)local_78.start + 0x30) == '\x01') {
            iVar9 = iVar9 + *(long *)((long)local_78.start + 0x20) * 8;
          }
          local_78.start = (data_ptr_t)piVar7;
          bVar4 = DataTable::HasIndexes(*(DataTable **)piVar7);
          uVar11 = uVar10 & 0xffffffffff0000ff | 0x10000;
          if (!bVar4) {
            uVar11 = uVar10;
          }
          uVar11 = uVar11 & 0xffffffffffff00ff | 0x100;
        }
        else {
          uVar11 = uVar10;
          local_78.start = (data_ptr_t)piVar7;
          if (iVar1 == 4) {
            uVar11 = (uVar10 & 0xffffffffffffff00) + 1;
          }
        }
        uVar10 = uVar11;
      }
      pUVar6 = optional_ptr<duckdb::UndoBufferEntry,_true>::operator->(&local_78.current);
      local_78.current.ptr = (pUVar6->prev).ptr;
    }
    BufferHandle::~BufferHandle(&local_78.handle);
  }
  UVar12.has_updates = (bool)(char)uVar10;
  UVar12.has_deletes = (bool)(char)(uVar10 >> 8);
  UVar12.has_index_deletes = (bool)(char)(uVar10 >> 0x10);
  UVar12.has_catalog_changes = (bool)(char)(uVar10 >> 0x18);
  UVar12.has_dropped_entries = (bool)(char)(uVar10 >> 0x20);
  UVar12._13_3_ = (int3)(uVar10 >> 0x28);
  UVar12.estimated_size = iVar9;
  return UVar12;
}

Assistant:

UndoBufferProperties UndoBuffer::GetProperties() {
	UndoBufferProperties properties;
	if (!ChangesMade()) {
		return properties;
	}
	auto node = allocator.head.get();
	while (node) {
		properties.estimated_size += node->position;
		node = node->next.get();
	}

	// we need to search for any index creation entries
	IteratorState iterator_state;
	IterateEntries(iterator_state, [&](UndoFlags entry_type, data_ptr_t data) {
		switch (entry_type) {
		case UndoFlags::UPDATE_TUPLE:
			properties.has_updates = true;
			break;
		case UndoFlags::DELETE_TUPLE: {
			auto info = reinterpret_cast<DeleteInfo *>(data);
			if (info->is_consecutive) {
				properties.estimated_size += sizeof(row_t) * info->count;
			}
			if (info->table->HasIndexes()) {
				properties.has_index_deletes = true;
			}
			properties.has_deletes = true;
			break;
		}
		case UndoFlags::CATALOG_ENTRY: {
			properties.has_catalog_changes = true;

			auto catalog_entry = Load<CatalogEntry *>(data);
			auto &parent = catalog_entry->Parent();
			switch (parent.type) {
			case CatalogType::DELETED_ENTRY:
				properties.has_dropped_entries = true;
				break;
			case CatalogType::INDEX_ENTRY: {
				auto &index = parent.Cast<DuckIndexEntry>();
				properties.estimated_size += index.initial_index_size;
				break;
			}
			default:
				break;
			}
			break;
		}
		default:
			break;
		}
	});
	return properties;
}